

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xts.cc
# Opt level: O1

int aes_xts_init_key(EVP_CIPHER_CTX *ctx,uint8_t *key,uint8_t *iv,int enc)

{
  AES_KEY *key_00;
  undefined8 uVar1;
  code *pcVar2;
  int bits;
  
  if (key != (uint8_t *)0x0 || iv != (uint8_t *)0x0) {
    key_00 = (AES_KEY *)ctx->cipher_data;
    if (key != (uint8_t *)0x0) {
      bits = ctx->key_len << 2;
      if (enc == 0) {
        AES_set_decrypt_key(key,bits,key_00);
        pcVar2 = AES_decrypt;
      }
      else {
        AES_set_encrypt_key(key,bits,key_00);
        pcVar2 = AES_encrypt;
      }
      *(code **)(key_00[2].rd_key + 6) = pcVar2;
      AES_set_encrypt_key(key + (ctx->key_len >> 1),ctx->key_len << 2,
                          (AES_KEY *)(key_00[1].rd_key + 1));
      *(code **)(key_00[2].rd_key + 8) = AES_encrypt;
      *(AES_KEY **)(key_00[2].rd_key + 2) = key_00;
    }
    if (iv != (uint8_t *)0x0) {
      *(uint **)(key_00[2].rd_key + 4) = key_00[1].rd_key + 1;
      uVar1 = *(undefined8 *)(iv + 8);
      *(undefined8 *)ctx->iv = *(undefined8 *)iv;
      *(undefined8 *)(ctx->iv + 8) = uVar1;
    }
  }
  return 1;
}

Assistant:

static int aes_xts_init_key(EVP_CIPHER_CTX *ctx, const uint8_t *key,
                            const uint8_t *iv, int enc) {
  EVP_AES_XTS_CTX *xctx = reinterpret_cast<EVP_AES_XTS_CTX *>(ctx->cipher_data);
  if (!iv && !key) {
    return 1;
  }

  if (key) {
    // key_len is two AES keys
    if (enc) {
      AES_set_encrypt_key(key, ctx->key_len * 4, &xctx->ks1.ks);
      xctx->xts.block1 = AES_encrypt;
    } else {
      AES_set_decrypt_key(key, ctx->key_len * 4, &xctx->ks1.ks);
      xctx->xts.block1 = AES_decrypt;
    }

    AES_set_encrypt_key(key + ctx->key_len / 2, ctx->key_len * 4,
                        &xctx->ks2.ks);
    xctx->xts.block2 = AES_encrypt;
    xctx->xts.key1 = &xctx->ks1.ks;
  }

  if (iv) {
    xctx->xts.key2 = &xctx->ks2.ks;
    OPENSSL_memcpy(ctx->iv, iv, 16);
  }

  return 1;
}